

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::copyAppend
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,Output *b,Output *e)

{
  Output *pOVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  qreal qVar5;
  qreal qVar6;
  drmModePropertyPtr p_Var7;
  drmModePropertyBlobPtr p_Var8;
  QKmsPlane *pQVar9;
  QSize QVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Output *pOVar14;
  int iVar15;
  bool bVar16;
  undefined7 uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  undefined4 uVar21;
  undefined3 uVar22;
  bool bVar23;
  bool bVar24;
  undefined3 uVar25;
  long lVar26;
  QImage *pQVar27;
  long lVar28;
  QImage *this_00;
  QImage *pQVar29;
  
  if ((b != e) && (b < e)) {
    pOVar1 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
    lVar26 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
    pQVar27 = &b->fb[0].wrapper;
    do {
      pDVar2 = (b->kmsOutput).name.d.d;
      pOVar1[lVar26].kmsOutput.name.d.d = pDVar2;
      pOVar1[lVar26].kmsOutput.name.d.ptr = (b->kmsOutput).name.d.ptr;
      pOVar1[lVar26].kmsOutput.name.d.size = (b->kmsOutput).name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pOVar1[lVar26].kmsOutput.saved_crtc = (b->kmsOutput).saved_crtc;
      uVar18 = (b->kmsOutput).connector_id;
      uVar19 = (b->kmsOutput).crtc_index;
      uVar20 = (b->kmsOutput).crtc_id;
      uVar21 = *(undefined4 *)&(b->kmsOutput).field_0x24;
      qVar5 = (b->kmsOutput).physical_size.wd;
      qVar6 = (b->kmsOutput).physical_size.ht;
      iVar15 = (b->kmsOutput).mode;
      bVar16 = (b->kmsOutput).mode_set;
      uVar17 = *(undefined7 *)&(b->kmsOutput).field_0x41;
      pOVar1[lVar26].kmsOutput.preferred_mode = (b->kmsOutput).preferred_mode;
      pOVar1[lVar26].kmsOutput.mode = iVar15;
      pOVar1[lVar26].kmsOutput.mode_set = bVar16;
      *(undefined7 *)&pOVar1[lVar26].kmsOutput.field_0x41 = uVar17;
      pOVar1[lVar26].kmsOutput.physical_size.wd = qVar5;
      pOVar1[lVar26].kmsOutput.physical_size.ht = qVar6;
      pOVar1[lVar26].kmsOutput.connector_id = uVar18;
      pOVar1[lVar26].kmsOutput.crtc_index = uVar19;
      pOVar1[lVar26].kmsOutput.crtc_id = uVar20;
      *(undefined4 *)&pOVar1[lVar26].kmsOutput.field_0x24 = uVar21;
      pDVar3 = (b->kmsOutput).modes.d.d;
      pOVar1[lVar26].kmsOutput.modes.d.d = pDVar3;
      pOVar1[lVar26].kmsOutput.modes.d.ptr = (b->kmsOutput).modes.d.ptr;
      pOVar1[lVar26].kmsOutput.modes.d.size = (b->kmsOutput).modes.d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar15 = (b->kmsOutput).subpixel;
      uVar21 = *(undefined4 *)&(b->kmsOutput).field_0x6c;
      p_Var7 = (b->kmsOutput).dpms_prop;
      p_Var8 = (b->kmsOutput).edid_blob;
      bVar24 = (b->kmsOutput).wants_forced_plane;
      uVar25 = *(undefined3 *)&(b->kmsOutput).field_0x81;
      uVar20 = (b->kmsOutput).forced_plane_id;
      uVar18 = (b->kmsOutput).forced_plane_id;
      bVar16 = (b->kmsOutput).forced_plane_set;
      uVar22 = *(undefined3 *)&(b->kmsOutput).field_0x89;
      uVar19 = (b->kmsOutput).drm_format;
      bVar23 = (b->kmsOutput).drm_format_requested_by_user;
      pOVar14 = pOVar1 + lVar26;
      *(undefined3 *)&(pOVar14->kmsOutput).field_0x81 = *(undefined3 *)&(b->kmsOutput).field_0x81;
      (pOVar14->kmsOutput).forced_plane_id = uVar18;
      (pOVar14->kmsOutput).forced_plane_set = bVar16;
      pOVar14 = pOVar1 + lVar26;
      *(undefined3 *)&(pOVar14->kmsOutput).field_0x89 = uVar22;
      (pOVar14->kmsOutput).drm_format = uVar19;
      (pOVar14->kmsOutput).drm_format_requested_by_user = bVar23;
      pOVar1[lVar26].kmsOutput.edid_blob = p_Var8;
      pOVar14 = pOVar1 + lVar26;
      (pOVar14->kmsOutput).wants_forced_plane = bVar24;
      *(undefined3 *)&(pOVar14->kmsOutput).field_0x81 = uVar25;
      (pOVar14->kmsOutput).forced_plane_id = uVar20;
      pOVar1[lVar26].kmsOutput.subpixel = iVar15;
      *(undefined4 *)&pOVar1[lVar26].kmsOutput.field_0x6c = uVar21;
      pOVar1[lVar26].kmsOutput.dpms_prop = p_Var7;
      pDVar2 = (b->kmsOutput).clone_source.d.d;
      pOVar1[lVar26].kmsOutput.clone_source.d.d = pDVar2;
      pOVar1[lVar26].kmsOutput.clone_source.d.ptr = (b->kmsOutput).clone_source.d.ptr;
      pOVar1[lVar26].kmsOutput.clone_source.d.size = (b->kmsOutput).clone_source.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->kmsOutput).available_planes.d.d;
      pOVar1[lVar26].kmsOutput.available_planes.d.d = pDVar4;
      pOVar1[lVar26].kmsOutput.available_planes.d.ptr = (b->kmsOutput).available_planes.d.ptr;
      pOVar1[lVar26].kmsOutput.available_planes.d.size = (b->kmsOutput).available_planes.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar9 = (b->kmsOutput).eglfs_plane;
      QVar10 = (b->kmsOutput).size;
      uVar18 = (b->kmsOutput).modeIdPropertyId;
      uVar19 = (b->kmsOutput).activePropertyId;
      uVar20 = (b->kmsOutput).mode_blob_id;
      pOVar1[lVar26].kmsOutput.crtcIdPropertyId = (b->kmsOutput).crtcIdPropertyId;
      pOVar1[lVar26].kmsOutput.modeIdPropertyId = uVar18;
      pOVar1[lVar26].kmsOutput.activePropertyId = uVar19;
      pOVar1[lVar26].kmsOutput.mode_blob_id = uVar20;
      pOVar1[lVar26].kmsOutput.eglfs_plane = pQVar9;
      pOVar1[lVar26].kmsOutput.size = QVar10;
      this_00 = &pOVar1[lVar26].fb[0].wrapper;
      lVar28 = 2;
      pQVar29 = pQVar27;
      do {
        uVar11 = *(undefined8 *)(pQVar29 + -0x20);
        uVar12 = *(undefined8 *)(pQVar29 + -0x18);
        uVar13 = *(undefined8 *)(pQVar29 + -8);
        *(undefined8 *)(this_00 + -0x10) = *(undefined8 *)(pQVar29 + -0x10);
        *(undefined8 *)(this_00 + -8) = uVar13;
        *(undefined8 *)(this_00 + -0x20) = uVar11;
        *(undefined8 *)(this_00 + -0x18) = uVar12;
        QImage::QImage(this_00,pQVar29);
        pQVar29 = pQVar29 + 0x38;
        this_00 = this_00 + 0x38;
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      lVar28 = 0x158;
      do {
        QRegion::QRegion((QRegion *)((long)&pOVar1[lVar26].kmsOutput.name.d.d + lVar28),
                         (QRegion *)((long)&(b->kmsOutput).name.d.d + lVar28));
        lVar28 = lVar28 + 8;
      } while (lVar28 != 0x168);
      pOVar1[lVar26].flipped = b->flipped;
      pOVar1[lVar26].backFb = b->backFb;
      b = b + 1;
      lVar26 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size + 1;
      (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size = lVar26;
      pQVar27 = pQVar27 + 0x170;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }